

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

optional<unsigned_short> * __thiscall
std::experimental::optional<unsigned_short>::operator=
          (optional<unsigned_short> *this,optional<unsigned_short> *rhs)

{
  bool bVar1;
  unsigned_short *puVar2;
  
  bVar1 = (rhs->super_OptionalBase<unsigned_short>).init_;
  if ((this->super_OptionalBase<unsigned_short>).init_ == true) {
    if (bVar1 == false) {
      (this->super_OptionalBase<unsigned_short>).init_ = false;
    }
    else {
      puVar2 = operator*(rhs);
      (this->super_OptionalBase<unsigned_short>).storage_.value_ = *puVar2;
    }
  }
  else if (bVar1 != false) {
    puVar2 = operator*(rhs);
    initialize<unsigned_short>(this,puVar2);
  }
  return this;
}

Assistant:

optional& operator=(optional&& rhs)
  noexcept(is_nothrow_move_assignable<T>::value && is_nothrow_move_constructible<T>::value)
  {
    if      (initialized() == true  && rhs.initialized() == false) clear();
    else if (initialized() == false && rhs.initialized() == true)  initialize(std::move(*rhs));
    else if (initialized() == true  && rhs.initialized() == true)  contained_val() = std::move(*rhs);
    return *this;
  }